

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int phf_keycmp<phf_string>(phf_key<phf_string> *a,phf_key<phf_string> *b)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((((*a->n <= *b->n) && (iVar4 = 1, *b->n <= *a->n)) &&
      (uVar1 = b->g, uVar2 = a->g, iVar4 = -1, uVar1 > uVar2 || uVar2 == uVar1)) &&
     (iVar4 = 1, uVar1 <= uVar2)) {
    bVar3 = operator==(&a->k,&b->k);
    iVar4 = 0;
    if ((a != b) && (bVar3)) {
      __assert_fail("!(a->k == b->k)",
                    "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                    ,0x1e4,"int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = phf_string]"
                   );
    }
  }
  return iVar4;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}